

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O0

void __thiscall CSocekt::inRecyConnectQueue(CSocekt *this,lp_connection_t pConn)

{
  bool bVar1;
  reference ppfVar2;
  time_t tVar3;
  flyd_connection_s *in_RSI;
  MutexLock *in_RDI;
  iterator pos;
  MutexLockGuard lock;
  bool iffind;
  MutexLockGuard *in_stack_ffffffffffffffb0;
  value_type *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  _Self local_30;
  _Self local_28 [2];
  byte local_11;
  flyd_connection_s *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  muduo::MutexLockGuard::MutexLockGuard(in_stack_ffffffffffffffb0,in_RDI);
  local_28[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::begin
                 ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)in_RDI);
  do {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::end
                   ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)in_RDI);
    bVar1 = std::operator!=(local_28,&local_30);
    if (!bVar1) {
LAB_0013eaac:
      if ((local_11 & 1) != 1) {
        tVar3 = time((time_t *)0x0);
        local_10->inRecyTime = tVar3;
        local_10->iCurrsequence = local_10->iCurrsequence + 1;
        std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::push_back
                  ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
        muduo::detail::AtomicIntegerT<int>::increment((AtomicIntegerT<int> *)0x13eb13);
      }
      muduo::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x13eb43);
      return;
    }
    ppfVar2 = std::_List_iterator<flyd_connection_s_*>::operator*
                        ((_List_iterator<flyd_connection_s_*> *)0x13ea86);
    if (*ppfVar2 == local_10) {
      local_11 = 1;
      goto LAB_0013eaac;
    }
    std::_List_iterator<flyd_connection_s_*>::operator++(local_28,0);
  } while( true );
}

Assistant:

void CSocekt::inRecyConnectQueue(lp_connection_t pConn)
{
    //ngx_log_stderr(0,"CSocekt::inRecyConnectQueue()执行，连接入到回收队列中.");
    
  //  std::list<lp_connection_t>::iterator pos;
    bool iffind = false;
    muduo::MutexLockGuard lock(m_recyconnqueueMutex); //针对连接回收列表的互斥量，因为线程ServerRecyConnectionThread()也有要用到这个回收列表；

    //先检查一下这个连接之前在不在队列中，防止被重复添加
    for(auto pos = m_recyconnectionList.begin(); pos != m_recyconnectionList.end(); pos++)
    {
        if((*pos) == pConn)
        {
            iffind = true;
            break;
        }
    }

    if(iffind == true)
    return ;

    pConn->inRecyTime = time(NULL);        //记录回收时间
    ++pConn->iCurrsequence;
    m_recyconnectionList.push_back(pConn); //等待ServerRecyConnectionThread线程自会处理 
    m_total_recyconnection_n.increment();            //待释放连接队列大小+1
    return;
}